

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgConvexHull3d.cpp
# Opt level: O3

void __thiscall
dgConvexHull3d::dgConvexHull3d
          (dgConvexHull3d *this,HaF64 *vertexCloud,HaI32 strideInBytes,HaI32 count,HaF64 distTol,
          HaI32 maxVertexCount)

{
  (this->super_dgList<dgConvexHull3DFace>).m_count = 0;
  (this->super_dgList<dgConvexHull3DFace>).m_last = (dgListNode *)0x0;
  (this->super_dgList<dgConvexHull3DFace>).m_first = (dgListNode *)0x0;
  (this->super_dgList<dgConvexHull3DFace>)._vptr_dgList =
       (_func_int **)&PTR__dgConvexHull3d_00b42988;
  this->m_count = 0;
  this->m_diag = 0.0;
  (this->m_points).m_granulatity = count;
  (this->m_points).m_array = (dgBigVector *)0x0;
  (this->m_points).m_aligmentInByte = 0x10;
  (this->m_points).m_maxSize = 0;
  BuildHull(this,vertexCloud,strideInBytes,count,distTol,maxVertexCount);
  return;
}

Assistant:

dgConvexHull3d::dgConvexHull3d(const hacd::HaF64* const vertexCloud, hacd::HaI32 strideInBytes, hacd::HaI32 count, hacd::HaF64 distTol, hacd::HaI32 maxVertexCount)
	:dgList<dgConvexHull3DFace>(),  m_count (0), m_diag(), m_points(count) 
{
	BuildHull (vertexCloud, strideInBytes, count, distTol, maxVertexCount);
}